

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

StmNode * __thiscall Canonicalizer::visit(Canonicalizer *this,SEQ *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  SEQ *pSVar3;
  long *plVar4;
  StmNode *pSVar5;
  SEQ *pSVar6;
  long *plVar7;
  StmNode *pSVar8;
  undefined4 extraout_var_02;
  StmNode *right;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[6])(node);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[6])(node);
    iVar1 = StmNode::getTypeStm((StmNode *)CONCAT44(extraout_var_00,iVar1));
    if (iVar1 == 0xc) {
      iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[6])(node);
      plVar7 = (long *)CONCAT44(extraout_var_01,iVar1);
      this->changed = true;
      lVar2 = (**(code **)(*plVar7 + 0x30))(plVar7);
      if ((lVar2 != 0) && (lVar2 = (**(code **)(*plVar7 + 0x38))(plVar7), lVar2 != 0)) {
        pSVar3 = (SEQ *)operator_new(0x20);
        plVar4 = (long *)(**(code **)(*plVar7 + 0x30))(plVar7);
        pSVar5 = (StmNode *)(**(code **)(*plVar4 + 0x18))(plVar4,this);
        pSVar6 = (SEQ *)operator_new(0x20);
        plVar7 = (long *)(**(code **)(*plVar7 + 0x38))(plVar7);
        pSVar8 = (StmNode *)(**(code **)(*plVar7 + 0x18))(plVar7,this);
        iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[7])(node);
        right = (StmNode *)
                (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x18))
                          ((long *)CONCAT44(extraout_var_02,iVar1),this);
        SEQ::SEQ(pSVar6,pSVar8,right);
        SEQ::SEQ(pSVar3,pSVar5,(StmNode *)pSVar6);
        return &pSVar3->super_StmNode;
      }
      lVar2 = (**(code **)(*plVar7 + 0x30))(plVar7);
      if ((lVar2 != 0) && (lVar2 = (**(code **)(*plVar7 + 0x38))(plVar7), lVar2 == 0)) {
        pSVar3 = (SEQ *)operator_new(0x20);
        plVar7 = (long *)(**(code **)(*plVar7 + 0x30))(plVar7);
        pSVar5 = (StmNode *)(**(code **)(*plVar7 + 0x18))(plVar7);
        pSVar6 = (SEQ *)operator_new(0x20);
        SEQ::SEQ(pSVar6,(StmNode *)0x0,(StmNode *)0x0);
        SEQ::SEQ(pSVar3,pSVar5,(StmNode *)pSVar6);
        return &pSVar3->super_StmNode;
      }
      lVar2 = (**(code **)(*plVar7 + 0x30))(plVar7);
      if ((lVar2 == 0) && (lVar2 = (**(code **)(*plVar7 + 0x38))(plVar7), lVar2 != 0)) {
        pSVar3 = (SEQ *)operator_new(0x20);
        pSVar6 = (SEQ *)operator_new(0x20);
        plVar7 = (long *)(**(code **)(*plVar7 + 0x38))(plVar7);
        pSVar5 = (StmNode *)(**(code **)(*plVar7 + 0x18))(plVar7,this);
        iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[7])(node);
        pSVar8 = (StmNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar1) + 0x18))
                           ((long *)CONCAT44(extraout_var_07,iVar1),this);
        SEQ::SEQ(pSVar6,pSVar5,pSVar8);
        SEQ::SEQ(pSVar3,(StmNode *)0x0,(StmNode *)pSVar6);
        return &pSVar3->super_StmNode;
      }
      pSVar3 = (SEQ *)operator_new(0x20);
      pSVar6 = (SEQ *)operator_new(0x20);
      SEQ::SEQ(pSVar6,(StmNode *)0x0,(StmNode *)0x0);
      SEQ::SEQ(pSVar3,(StmNode *)0x0,(StmNode *)pSVar6);
      return &pSVar3->super_StmNode;
    }
  }
  iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[6])(node);
  if (CONCAT44(extraout_var_03,iVar1) != 0) {
    iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[6])(node);
    pSVar5 = (StmNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var_04,iVar1),this);
    SEQ::setS1(node,pSVar5);
  }
  iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[7])(node);
  if (CONCAT44(extraout_var_05,iVar1) != 0) {
    iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[7])(node);
    pSVar5 = (StmNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var_06,iVar1),this);
    SEQ::setS2(node,pSVar5);
  }
  return &node->super_StmNode;
}

Assistant:

StmNode *Canonicalizer::visit(SEQ *node) {
    if (node->getS1() && node->getS1()->getTypeStm() == V_SEQ) {
        StmNode *seq = node->getS1();
        changed = true;
        if (seq->getS1() && seq->getS2()) {
            return new SEQ(seq->getS1()->accept(this),
                           new SEQ(seq->getS2()->accept(this),
                                   node->getS2()->accept(this)));
        }else if(seq->getS1()!=NULL && seq->getS2()==NULL)
        {
            return new SEQ(seq->getS1()->accept(this),new SEQ(NULL,NULL));
        }else if(seq->getS1()==NULL && seq->getS2()!=NULL)
        {
            return new SEQ(NULL, new SEQ(seq->getS2()->accept(this), node->getS2()->accept(this)));
        }else
        {
            return new SEQ(NULL, new SEQ(NULL,NULL));
        }
    } else {
        if (node->getS1()) node->setS1(node->getS1()->accept(this));
        if (node->getS2()) node->setS2(node->getS2()->accept(this));
    }
    return node;
}